

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessToken
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  Value *pVVar4;
  size_type sVar5;
  element_type *this_00;
  const_reference pvVar6;
  undefined4 extraout_var;
  element_type *peVar7;
  ByteArray *aBytes;
  Network *aRet;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar8;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  anon_class_1_0_00000001 local_d82;
  v10 local_d81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d80;
  char *local_d78;
  string local_d70;
  Error local_d50;
  Value local_d28;
  ErrorCode local_cdc;
  Error local_cd8;
  Value local_cb0;
  ErrorCode local_c64;
  Error local_c60;
  Value local_c38;
  anon_class_1_0_00000001 local_bea;
  v10 local_be9;
  v10 *local_be8;
  size_t local_be0;
  string local_bd8;
  Error local_bb8;
  Value local_b90;
  undefined1 local_b48 [8];
  ByteArray signedToken_1;
  string local_b28;
  int local_b04;
  string local_b00;
  Value local_ae0;
  anon_class_1_0_00000001 local_a92;
  v10 local_a91;
  v10 *local_a90;
  size_t local_a88;
  string local_a80;
  Error local_a60;
  Value local_a38;
  undefined1 local_9f0 [8];
  ByteArray signedToken;
  string local_9d0;
  anon_class_1_0_00000001 local_9aa;
  v10 local_9a9;
  v10 *local_9a8;
  size_t local_9a0;
  string local_998;
  Error local_978;
  Value local_950;
  ErrorCode local_904;
  Error local_900;
  Value local_8d8;
  ErrorCode local_88c;
  Error local_888;
  Value local_860;
  ushort local_816 [2];
  anon_class_1_0_00000001 local_812;
  v10 local_811;
  uint16_t port;
  v10 *pvStack_810;
  size_t local_808;
  string local_800;
  Error local_7e0;
  Value local_7b8;
  allocator local_769;
  string local_768;
  undefined1 local_748 [7];
  v10 local_741;
  undefined8 local_740;
  char *local_738;
  string local_730;
  Error local_710;
  Value local_6e8;
  anon_class_1_0_00000001 local_69a;
  v10 local_699;
  v10 *local_698;
  size_t local_690;
  string local_688;
  Error local_668;
  Value local_640;
  ErrorCode local_5f4;
  Error local_5f0;
  Value local_5c8;
  undefined1 local_570 [8];
  Network curNwk;
  undefined1 local_508 [7];
  RegistryStatus status;
  CommissionerAppPtr commissioner;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_4c0 [16];
  v10 *local_4b0;
  ulong local_4a8;
  v10 *local_4a0;
  size_t sStack_498;
  string *local_490;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_488 [3];
  undefined1 local_470 [16];
  v10 *local_460;
  ulong local_458;
  v10 *local_450;
  size_t sStack_448;
  string *local_440;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_438 [3];
  undefined1 local_420 [16];
  v10 *local_410;
  ulong local_408;
  v10 *local_400;
  size_t sStack_3f8;
  string *local_3f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3e8 [3];
  undefined1 local_3d0 [16];
  v10 *local_3c0;
  ulong local_3b8;
  v10 *local_3b0;
  size_t sStack_3a8;
  string *local_3a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_398 [3];
  undefined1 local_380 [16];
  v10 *local_370;
  ulong local_368;
  v10 *local_360;
  size_t sStack_358;
  string *local_350;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_348 [2];
  undefined1 local_338 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  char *local_320;
  const_reference local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  char *pcStack_308;
  string *local_300;
  v10 *local_2f8;
  v10 **local_2f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_2e8 [3];
  undefined1 local_2d0 [16];
  v10 *local_2c0;
  char *local_2b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_2b0;
  v10 *local_2a8;
  char *pcStack_2a0;
  string *local_298;
  v10 *local_290;
  undefined8 *local_288;
  v10 *local_280;
  undefined1 *local_278;
  v10 *local_270;
  v10 **local_268;
  v10 *local_260;
  v10 **local_258;
  v10 *local_250;
  v10 **local_248;
  v10 *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_238;
  v10 **local_230;
  v10 *local_228;
  size_t sStack_220;
  v10 **local_210;
  v10 *local_208;
  size_t sStack_200;
  v10 **local_1f0;
  v10 *local_1e8;
  size_t sStack_1e0;
  v10 **local_1d0;
  v10 *local_1c8;
  size_t sStack_1c0;
  v10 **local_1b0;
  v10 *local_1a8;
  size_t sStack_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_190;
  undefined1 *local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_180;
  undefined1 *local_178;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_170;
  undefined1 *local_168;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_160;
  undefined1 *local_158;
  Value **local_150;
  undefined1 *local_148;
  Value **local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_138;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_120;
  Value **local_118;
  undefined8 local_110;
  undefined1 *local_108;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_100;
  undefined8 local_f8;
  undefined1 *local_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_10;
  
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  Value::Value(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_508,(nullptr_t)0x0);
  persistent_storage::Network::Network((Network *)local_570);
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mJobManager);
  JobManager::GetSelectedCommissioner(&local_5f0,peVar3,(CommissionerAppPtr *)local_508);
  Value::Value(&local_5c8,&local_5f0);
  pVVar4 = Value::operator=(__return_storage_ptr__,&local_5c8);
  local_5f4 = kNone;
  bVar1 = Value::operator!=(pVVar4,&local_5f4);
  Value::~Value(&local_5c8);
  Error::~Error(&local_5f0);
  if (!bVar1) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(aExpr);
    if (sVar5 < 2) {
      ProcessToken::anon_class_1_0_00000001::operator()(&local_69a);
      local_2f0 = &local_698;
      local_2f8 = &local_699;
      bVar8 = ::fmt::v10::operator()(local_2f8);
      local_690 = bVar8.size_;
      local_698 = (v10 *)bVar8.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_350 = &local_688;
      local_360 = local_698;
      sStack_358 = local_690;
      local_230 = &local_360;
      local_370 = local_698;
      local_368 = local_690;
      local_228 = local_370;
      sStack_220 = local_368;
      local_398[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_188 = local_380;
      local_190 = local_398;
      local_b0 = 0;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_190;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_368;
      local_120 = local_190;
      local_b8 = local_190;
      local_a8 = local_188;
      ::fmt::v10::vformat_abi_cxx11_(&local_688,local_370,fmt,args);
      Error::Error(&local_668,kInvalidArgs,&local_688);
      Value::Value(&local_640,&local_668);
      Value::operator=(__return_storage_ptr__,&local_640);
      Value::~Value(&local_640);
      Error::~Error(&local_668);
      std::__cxx11::string::~string((string *)&local_688);
    }
    else {
      this_00 = std::
                __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mRegistry);
      aRet = (Network *)local_570;
      curNwk._95_1_ = persistent_storage::Registry::GetCurrentNetwork(this_00,aRet);
      if (curNwk._95_1_ == kSuccess) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](aExpr,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_768,"request",&local_769);
        bVar1 = CaseInsensitiveEqual(pvVar6,&local_768);
        std::__cxx11::string::~string((string *)&local_768);
        std::allocator<char>::~allocator((allocator<char> *)&local_769);
        if (bVar1) {
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(aExpr);
          if (sVar5 < 4) {
            ProcessToken::anon_class_1_0_00000001::operator()(&local_812);
            local_278 = (undefined1 *)&stack0xfffffffffffff7f0;
            local_280 = &local_811;
            bVar8 = ::fmt::v10::operator()(local_280);
            local_808 = bVar8.size_;
            pvStack_810 = (v10 *)bVar8.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_3a0 = &local_800;
            local_3b0 = pvStack_810;
            sStack_3a8 = local_808;
            local_210 = &local_3b0;
            local_3c0 = pvStack_810;
            local_3b8 = local_808;
            local_208 = local_3c0;
            sStack_200 = local_3b8;
            local_3e8[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
            local_178 = local_3d0;
            local_180 = local_3e8;
            local_c8 = 0;
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)local_180;
            fmt_01.size_ = 0;
            fmt_01.data_ = (char *)local_3b8;
            local_128 = local_180;
            local_d0 = local_180;
            local_c0 = local_178;
            ::fmt::v10::vformat_abi_cxx11_(&local_800,local_3c0,fmt_01,args_01);
            Error::Error(&local_7e0,kInvalidArgs,&local_800);
            Value::Value(&local_7b8,&local_7e0);
            Value::operator=(__return_storage_ptr__,&local_7b8);
            Value::~Value(&local_7b8);
            Error::~Error(&local_7e0);
            std::__cxx11::string::~string((string *)&local_800);
          }
          else if ((local_570._0_4_ == 0xffffffff) || (curNwk.mMlp.field_2._8_4_ != 0)) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](aExpr,3);
            utils::ParseInteger<unsigned_short>(&local_888,local_816,pvVar6);
            Value::Value(&local_860,&local_888);
            pVVar4 = Value::operator=(__return_storage_ptr__,&local_860);
            local_88c = kNone;
            bVar1 = Value::operator!=(pVVar4,&local_88c);
            Value::~Value(&local_860);
            Error::~Error(&local_888);
            if (!bVar1) {
              peVar7 = std::
                       __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_508);
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](aExpr,2);
              (*(peVar7->super_CommissionerHandler)._vptr_CommissionerHandler[0x42])
                        (&local_900,peVar7,pvVar6,(ulong)local_816[0]);
              Value::Value(&local_8d8,&local_900);
              pVVar4 = Value::operator=(__return_storage_ptr__,&local_8d8);
              local_904 = kNone;
              bVar1 = Value::operator!=(pVVar4,&local_904);
              Value::~Value(&local_8d8);
              Error::~Error(&local_900);
              if ((!bVar1) && (local_570._0_4_ == 0xffffffff)) {
                peVar3 = std::
                         __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&this->mJobManager);
                JobManager::UpdateDefaultConfigCommissionerToken(peVar3);
              }
            }
          }
          else {
            ProcessToken::anon_class_1_0_00000001::operator()(&local_9aa);
            local_268 = &local_9a8;
            local_270 = &local_9a9;
            bVar8 = ::fmt::v10::operator()(local_270);
            local_9a0 = bVar8.size_;
            local_9a8 = (v10 *)bVar8.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_3f0 = &local_998;
            local_400 = local_9a8;
            sStack_3f8 = local_9a0;
            local_1f0 = &local_400;
            local_410 = local_9a8;
            local_408 = local_9a0;
            local_1e8 = local_410;
            sStack_1e0 = local_408;
            local_438[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
            local_168 = local_420;
            local_170 = local_438;
            local_e0 = 0;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_170;
            fmt_02.size_ = 0;
            fmt_02.data_ = (char *)local_408;
            local_130 = local_170;
            local_e8 = local_170;
            local_d8 = local_168;
            ::fmt::v10::vformat_abi_cxx11_(&local_998,local_410,fmt_02,args_02);
            Error::Error(&local_978,kInvalidState,&local_998);
            Value::Value(&local_950,&local_978);
            Value::operator=(__return_storage_ptr__,&local_950);
            Value::~Value(&local_950);
            Error::~Error(&local_978);
            std::__cxx11::string::~string((string *)&local_998);
          }
        }
        else {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](aExpr,1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_9d0,"print",
                     (allocator *)
                     ((long)&signedToken.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          bVar1 = CaseInsensitiveEqual(pvVar6,&local_9d0);
          std::__cxx11::string::~string((string *)&local_9d0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&signedToken.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          if (bVar1) {
            peVar7 = std::
                     __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_508);
            iVar2 = (*(peVar7->super_CommissionerHandler)._vptr_CommissionerHandler[0x41])();
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_9f0,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(extraout_var,iVar2));
            bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_9f0);
            if (bVar1) {
              ProcessToken::anon_class_1_0_00000001::operator()(&local_a92);
              local_258 = &local_a90;
              local_260 = &local_a91;
              bVar8 = ::fmt::v10::operator()(local_260);
              local_a88 = bVar8.size_;
              local_a90 = (v10 *)bVar8.data_;
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              local_440 = &local_a80;
              local_450 = local_a90;
              sStack_448 = local_a88;
              local_1d0 = &local_450;
              local_460 = local_a90;
              local_458 = local_a88;
              local_1c8 = local_460;
              sStack_1c0 = local_458;
              local_488[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                       ();
              local_158 = local_470;
              local_160 = local_488;
              local_f8 = 0;
              args_03.field_1.values_ = in_R9.values_;
              args_03.desc_ = (unsigned_long_long)local_160;
              fmt_03.size_ = 0;
              fmt_03.data_ = (char *)local_458;
              local_138 = local_160;
              local_100 = local_160;
              local_f0 = local_158;
              ::fmt::v10::vformat_abi_cxx11_(&local_a80,local_460,fmt_03,args_03);
              Error::Error(&local_a60,kNotFound,&local_a80);
              Value::Value(&local_a38,&local_a60);
              Value::operator=(__return_storage_ptr__,&local_a38);
              Value::~Value(&local_a38);
              Error::~Error(&local_a60);
              std::__cxx11::string::~string((string *)&local_a80);
              local_b04 = 4;
            }
            else {
              utils::Hex_abi_cxx11_(&local_b00,(utils *)local_9f0,aBytes);
              Value::Value(&local_ae0,&local_b00);
              Value::operator=(__return_storage_ptr__,&local_ae0);
              Value::~Value(&local_ae0);
              std::__cxx11::string::~string((string *)&local_b00);
              local_b04 = 0;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_9f0);
          }
          else {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](aExpr,1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_b28,"set",
                       (allocator *)
                       ((long)&signedToken_1.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            bVar1 = CaseInsensitiveEqual(pvVar6,&local_b28);
            std::__cxx11::string::~string((string *)&local_b28);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&signedToken_1.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            if (!bVar1) {
              ProcessToken::anon_class_1_0_00000001::operator()(&local_d82);
              local_238 = &local_d80;
              local_240 = &local_d81;
              bVar8 = ::fmt::v10::operator()(local_240);
              local_d78 = (char *)bVar8.size_;
              local_d80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          bVar8.data_;
              ::fmt::v10::detail::
              check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_318 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](aExpr,1);
              local_300 = &local_d70;
              local_310 = local_d80;
              pcStack_308 = local_d78;
              local_a0 = &local_310;
              local_328 = local_d80;
              local_320 = local_d78;
              local_98 = local_328;
              pcStack_90 = local_320;
              local_348[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                       ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_318,(v10 *)local_300,local_d80);
              local_78 = local_338;
              local_80 = local_348;
              local_68 = 0xd;
              args_05.field_1.values_ = in_R9.values_;
              args_05.desc_ = (unsigned_long_long)local_80;
              fmt_05.size_ = 0xd;
              fmt_05.data_ = local_320;
              local_70 = local_80;
              local_60 = local_78;
              local_58 = local_80;
              ::fmt::v10::vformat_abi_cxx11_(&local_d70,(v10 *)local_328,fmt_05,args_05);
              Error::Error(&local_d50,kInvalidCommand,&local_d70);
              Value::Value(&local_d28,&local_d50);
              Value::operator=(__return_storage_ptr__,&local_d28);
              Value::~Value(&local_d28);
              Error::~Error(&local_d50);
              std::__cxx11::string::~string((string *)&local_d70);
              goto LAB_00124bb4;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b48);
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(aExpr);
            if (sVar5 < 3) {
              ProcessToken::anon_class_1_0_00000001::operator()(&local_bea);
              local_248 = &local_be8;
              local_250 = &local_be9;
              bVar8 = ::fmt::v10::operator()(local_250);
              local_be0 = bVar8.size_;
              local_be8 = (v10 *)bVar8.data_;
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              local_490 = &local_bd8;
              local_4a0 = local_be8;
              sStack_498 = local_be0;
              local_1b0 = &local_4a0;
              local_4b0 = local_be8;
              local_4a8 = local_be0;
              local_1a8 = local_4b0;
              sStack_1a0 = local_4a8;
              value = (Value *)::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
              local_148 = local_4c0;
              local_150 = &value;
              local_110 = 0;
              args_04.field_1.values_ = in_R9.values_;
              args_04.desc_ = (unsigned_long_long)local_150;
              fmt_04.size_ = 0;
              fmt_04.data_ = (char *)local_4a8;
              local_140 = local_150;
              local_118 = local_150;
              local_108 = local_148;
              ::fmt::v10::vformat_abi_cxx11_(&local_bd8,local_4b0,fmt_04,args_04);
              Error::Error(&local_bb8,kInvalidArgs,&local_bd8);
              Value::Value(&local_b90,&local_bb8);
              Value::operator=(__return_storage_ptr__,&local_b90);
              Value::~Value(&local_b90);
              Error::~Error(&local_bb8);
              std::__cxx11::string::~string((string *)&local_bd8);
              local_b04 = 4;
            }
            else {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](aExpr,2);
              ReadHexStringFile(&local_c60,(ByteArray *)local_b48,pvVar6);
              Value::Value(&local_c38,&local_c60);
              pVVar4 = Value::operator=(__return_storage_ptr__,&local_c38);
              local_c64 = kNone;
              bVar1 = Value::operator!=(pVVar4,&local_c64);
              Value::~Value(&local_c38);
              Error::~Error(&local_c60);
              if (bVar1) {
                local_b04 = 4;
              }
              else {
                peVar7 = std::
                         __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_508);
                (*(peVar7->super_CommissionerHandler)._vptr_CommissionerHandler[0x43])
                          (&local_cd8,peVar7,local_b48);
                Value::Value(&local_cb0,&local_cd8);
                pVVar4 = Value::operator=(__return_storage_ptr__,&local_cb0);
                local_cdc = kNone;
                bVar1 = Value::operator!=(pVVar4,&local_cdc);
                Value::~Value(&local_cb0);
                Error::~Error(&local_cd8);
                if (bVar1) {
                  local_b04 = 4;
                }
                else {
                  if (local_570._0_4_ == 0xffffffff) {
                    peVar3 = std::
                             __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&this->mJobManager);
                    JobManager::UpdateDefaultConfigCommissionerToken(peVar3);
                  }
                  local_b04 = 0;
                }
              }
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b48);
          }
          if ((local_b04 != 0) && (local_b04 != 4)) goto LAB_00124bc5;
        }
      }
      else {
        ProcessToken::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(local_748 + 6));
        local_288 = &local_740;
        local_290 = &local_741;
        bVar8 = ::fmt::v10::operator()(local_290);
        local_738 = (char *)bVar8.size_;
        local_740 = bVar8.data_;
        ::fmt::v10::detail::check_format_string<int,_FMT_COMPILE_STRING,_0>();
        local_748._0_4_ = ZEXT14((byte)curNwk._95_1_);
        local_298 = &local_730;
        local_2a8 = (v10 *)local_740;
        pcStack_2a0 = local_738;
        local_2b0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int>
                     *)local_748;
        local_50 = &local_2a8;
        local_2c0 = (v10 *)local_740;
        local_2b8 = local_738;
        local_48 = local_2c0;
        pcStack_40 = local_2b8;
        local_2e8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                                 (local_2b0,(v10 *)aRet,(int *)local_298);
        local_30 = local_2d0;
        local_38 = local_2e8;
        local_20 = 1;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_38;
        fmt_00.size_ = 1;
        fmt_00.data_ = local_2b8;
        local_28 = local_38;
        local_18 = local_30;
        local_10 = local_38;
        ::fmt::v10::vformat_abi_cxx11_(&local_730,local_2c0,fmt_00,args_00);
        Error::Error(&local_710,kRegistryError,&local_730);
        Value::Value(&local_6e8,&local_710);
        Value::operator=(__return_storage_ptr__,&local_6e8);
        Value::~Value(&local_6e8);
        Error::~Error(&local_710);
        std::__cxx11::string::~string((string *)&local_730);
      }
    }
  }
LAB_00124bb4:
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 1;
  local_b04 = 1;
LAB_00124bc5:
  persistent_storage::Network::~Network((Network *)local_570);
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_508);
  if ((commissioner.
       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._7_1_ & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessToken(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;
    RegistryStatus     status;
    Network            curNwk;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    VerifyOrExit((status = mRegistry->GetCurrentNetwork(curNwk)) == RegistryStatus::kSuccess,
                 value = ERROR_REGISTRY_ERROR(RUNTIME_CUR_NETWORK_FAILED " with status={}", static_cast<int>(status)));

    if (CaseInsensitiveEqual(aExpr[1], "request"))
    {
        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        // request allowed in case of CCM network or no network selected
        if (curNwk.mId.mId == persistent_storage::EMPTY_ID || curNwk.mCcm != 0)
        {
            uint16_t port;
            SuccessOrExit(value = ParseInteger(port, aExpr[3]));
            SuccessOrExit(value = commissioner->RequestToken(aExpr[2], port));
            if (curNwk.mId.mId == persistent_storage::EMPTY_ID)
            {
                // when there is no network selected, a successful
                // 'token request' must update default configuration
                mJobManager->UpdateDefaultConfigCommissionerToken();
            }
        }
        else
        {
            ExitNow(value = ERROR_INVALID_STATE("request disallowed when non-CCM network selected"));
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "print"))
    {
        auto signedToken = commissioner->GetToken();
        VerifyOrExit(!signedToken.empty(), value = ERROR_NOT_FOUND("no valid Commissioner Token found"));
        value = utils::Hex(signedToken);
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        ByteArray signedToken;
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ReadHexStringFile(signedToken, aExpr[2]));

        SuccessOrExit(value = commissioner->SetToken(signedToken));
        if (curNwk.mId.mId == persistent_storage::EMPTY_ID)
        {
            // when there is no network selected, a successful
            // 'token set' must update default configuration
            // as well
            mJobManager->UpdateDefaultConfigCommissionerToken();
        }
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}